

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridges_articulations.cpp
# Opt level: O1

int count_rec(int v,int skip)

{
  ulong *puVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  
  uVar4 = (ulong)v;
  uVar6 = uVar4 + 0x3f;
  if (-1 < (long)uVar4) {
    uVar6 = uVar4;
  }
  puVar1 = (ulong *)(((long)uVar6 >> 6) * 8 + (anonymous_namespace)::usedcnt + -8 +
                    (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) * 8);
  *puVar1 = *puVar1 | 1L << ((byte)v & 0x3f);
  piVar7 = edge.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar4].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar2 = edge.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar4].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (piVar7 == piVar2) {
    iVar5 = 1;
  }
  else {
    iVar5 = 1;
    do {
      iVar3 = *piVar7;
      uVar6 = (ulong)iVar3;
      if (iVar3 != skip) {
        uVar4 = uVar6 + 0x3f;
        if (-1 < (long)uVar6) {
          uVar4 = uVar6;
        }
        if ((*(ulong *)(((long)uVar4 >> 6) * 8 + (anonymous_namespace)::usedcnt + -8 +
                       (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar6 & 0x3f) & 1) == 0) {
          iVar3 = count_rec(iVar3,skip);
          iVar5 = iVar5 + iVar3;
        }
      }
      piVar7 = piVar7 + 1;
    } while (piVar7 != piVar2);
  }
  return iVar5;
}

Assistant:

int count_rec(int v, int skip) {
    int cnt = 1;
    usedcnt[v] = true;

    for (int to : edge[v]) {
        if(to == skip || usedcnt[to]) 
            continue;

        cnt += count_rec(to, skip);
    }
    
    return cnt;
}